

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

bool __thiscall Router::Reachable(Router *this,Vec2 pos)

{
  float *pfVar1;
  ulong uVar2;
  pointer pvVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  
  fVar7 = pos.x;
  fVar8 = pos.y;
  bVar6 = false;
  bVar5 = false;
  if ((((0.0 <= fVar7) && (bVar5 = bVar6, fVar7 <= 60.0)) && (0.0 <= fVar8)) && (fVar8 <= 90.0)) {
    uVar2 = (ulong)this->ObstacleCount;
    bVar5 = (long)uVar2 < 1;
    if (0 < (long)uVar2) {
      pvVar3 = (this->Obstacles).
               super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = 1;
      do {
        pfVar1 = *(float **)
                  &(pvVar3->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                   super__Vector_impl_data;
        if (((*pfVar1 + -0.05 + -0.0001 < fVar7) && (fVar7 < pfVar1[4] + 0.05 + 0.0001)) &&
           ((pfVar1[1] + -0.05 + -0.0001 < fVar8 && (fVar8 < pfVar1[5] + 0.05 + 0.0001)))) {
          return bVar5;
        }
        bVar5 = uVar2 <= uVar4;
        pvVar3 = pvVar3 + 1;
        bVar6 = uVar4 != uVar2;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
  }
  return bVar5;
}

Assistant:

bool Router::Reachable(Vec2 pos)
{
    if (pos.x < 0 || pos.x > MapWidth || pos.y < 0 || pos.y > MapHeight)
        return false;
    for (int i = 0; i < ObstacleCount; ++i)
        if (pos.x > Obstacles[i][0].x - ObsBorder - EPS
            && pos.x < Obstacles[i][2].x + ObsBorder + EPS
            && pos.y > Obstacles[i][0].y - ObsBorder - EPS
            && pos.y < Obstacles[i][2].y + ObsBorder + EPS)
            return false;
    return true;
}